

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

void __thiscall tlx::SpacingLogger::~SpacingLogger(SpacingLogger *this)

{
  undefined *puVar1;
  char local_38;
  undefined7 uStack_37;
  long local_28 [2];
  
  local_38 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->oss_,&local_38,1);
  puVar1 = s_logger_output_hook;
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)puVar1 + 0x10))(puVar1,&local_38);
  if ((long *)CONCAT71(uStack_37,local_38) != local_28) {
    operator_delete((long *)CONCAT71(uStack_37,local_38),local_28[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->oss_);
  std::ios_base::~ios_base((ios_base *)&this->field_0x78);
  return;
}

Assistant:

SpacingLogger::~SpacingLogger() {
    oss_ << '\n';
    (*s_logger_output_hook).append_log_line(oss_.str());
}